

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O3

Extra_UnateInfo_t * Extra_UnateInfoAllocate(int nVars)

{
  Extra_UnateInfo_t *pEVar1;
  Extra_UnateVar_t *pEVar2;
  
  pEVar1 = (Extra_UnateInfo_t *)calloc(1,0x18);
  pEVar1->nVars = nVars;
  pEVar2 = (Extra_UnateVar_t *)calloc(1,(long)nVars << 2);
  pEVar1->pVars = pEVar2;
  return pEVar1;
}

Assistant:

Extra_UnateInfo_t *  Extra_UnateInfoAllocate( int nVars )
{
    Extra_UnateInfo_t * p;
    // allocate and clean the storage for unateness info
    p = ABC_ALLOC( Extra_UnateInfo_t, 1 );
    memset( p, 0, sizeof(Extra_UnateInfo_t) );
    p->nVars     = nVars;
    p->pVars     = ABC_ALLOC( Extra_UnateVar_t, nVars );  
    memset( p->pVars, 0, nVars * sizeof(Extra_UnateVar_t) );
    return p;
}